

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuApp.cpp
# Opt level: O2

void __thiscall tcu::App::onWatchdogTimeout(App *this)

{
  bool bVar1;
  
  bVar1 = de::Mutex::tryLock(&this->m_crashLock);
  if ((bVar1) && (this->m_crashed == false)) {
    this->m_crashed = true;
    TestLog::terminateCase(this->m_testCtx->m_log,QP_TEST_RESULT_TIMEOUT);
    die("Watchdog timer timeout");
    return;
  }
  return;
}

Assistant:

void App::onWatchdogTimeout (void)
{
	if (!m_crashLock.tryLock() || m_crashed)
		return; // In crash handler already.

	m_crashed = true;

	m_testCtx->getLog().terminateCase(QP_TEST_RESULT_TIMEOUT);
	die("Watchdog timer timeout");
}